

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

void process(void)

{
  ushort uVar1;
  ulong uVar2;
  FILE *__stream;
  Png *pPVar3;
  bool bVar4;
  byte bVar5;
  uint16_t color_00;
  uint32_t uVar6;
  ComparisonResult CVar7;
  uint uVar8;
  undefined8 uVar9;
  path *filePath;
  ImagePalette *this;
  const_iterator pvVar10;
  Rgba *this_00;
  reference pvVar11;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> *pvVar12;
  reference pvVar13;
  size_type sVar14;
  size_type sVar15;
  __tuple_element_t<0UL,_tuple<vector<unsigned_long,_default_init_allocator<unsigned_long,_allocator<unsigned_long>_>_>,_vector<Palette,_allocator<Palette>_>_>_>
  *mappings_00;
  __tuple_element_t<1UL,_tuple<vector<unsigned_long,_default_init_allocator<unsigned_long,_allocator<unsigned_long>_>_>,_vector<Palette,_allocator<Palette>_>_>_>
  *palettes_00;
  reference pvVar16;
  char *pcVar17;
  Tile TVar18;
  undefined1 auStack_28328 [8];
  UniqueTiles tiles;
  uint32_t nbTilesW;
  uint32_t nbTilesH;
  type *palettes;
  type *mappings;
  ushort uStack_2828a;
  const_iterator pvStack_28288;
  uint16_t color_1;
  const_iterator __end3;
  const_iterator __begin3;
  ProtoPalette *__range3;
  ProtoPalette *protoPal;
  iterator __end2_1;
  iterator __begin2_1;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> *__range2_1;
  size_t n;
  Rgba color;
  uint32_t x;
  uint32_t y;
  uint8_t nbColorsInTile;
  AttrmapEntry *attrs;
  ProtoPalette tileColors;
  Tile tile;
  iterator __end1;
  iterator __begin1;
  TilesVisitor *__range1;
  DefaultInitVec<AttrmapEntry> attrmap;
  undefined1 auStack_281a8 [8];
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> protoPalettes;
  value_type *slot;
  const_iterator __end2;
  const_iterator __begin2;
  ImagePalette *__range2;
  ImagePalette *colors;
  Png png;
  
  uVar9 = png_get_libpng_ver(0);
  Options::verbosePrint(&options,'\x01',"Using libpng %s\n",uVar9);
  Options::verbosePrint(&options,'\x02',"Reading tiles...\n");
  filePath = std::optional<std::filesystem::__cxx11::path>::operator*(&options.input);
  Png::Png((Png *)&colors,filePath);
  this = Png::getColors((Png *)&colors);
  if (2 < options.verbosity) {
    fputs("Image colors: [ ",_stderr);
    __end2 = ImagePalette::begin(this);
    pvVar10 = ImagePalette::end(this);
    for (; __end2 != pvVar10; __end2 = __end2 + 1) {
      protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)__end2;
      bVar4 = std::optional<Rgba>::has_value(__end2);
      __stream = _stderr;
      if (bVar4) {
        this_00 = std::optional<Rgba>::operator->
                            ((optional<Rgba> *)
                             protoPalettes.
                             super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage);
        uVar6 = Rgba::toCSS(this_00);
        fprintf(__stream,"#%08x, ",(ulong)uVar6);
      }
    }
    fputs("]\n",_stderr);
  }
  std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::vector
            ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)auStack_281a8);
  __range1 = (TilesVisitor *)0x0;
  attrmap.
  super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attrmap.
  super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>::
  vector((vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
          *)&__range1);
  Png::visitAsTiles((TilesVisitor *)&__begin1.y,(Png *)&colors);
  Png::TilesVisitor::begin((iterator *)&__end1.y,(TilesVisitor *)&__begin1.y);
  Png::TilesVisitor::end((iterator *)&tile.x,(TilesVisitor *)&__begin1.y);
  do {
    bVar4 = operator!=((iterator *)&__end1.y,(iterator *)&tile.x);
    if (!bVar4) {
      sVar14 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::size
                         ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)auStack_281a8);
      sVar15 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::size
                         ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)auStack_281a8);
      pcVar17 = "";
      if (sVar15 != 1) {
        pcVar17 = "s";
      }
      Options::verbosePrint(&options,'\x03',"Image contains %zu proto-palette%s\n",sVar14,pcVar17);
      if (2 < options.verbosity) {
        __end2_1 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::begin
                             ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)auStack_281a8);
        protoPal = (ProtoPalette *)
                   std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::end
                             ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)auStack_281a8);
        while (bVar4 = __gnu_cxx::
                       operator==<ProtoPalette_*,_std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>_>
                                 (&__end2_1,
                                  (__normal_iterator<ProtoPalette_*,_std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>_>
                                   *)&protoPal), ((bVar4 ^ 0xffU) & 1) != 0) {
          __range3 = __gnu_cxx::
                     __normal_iterator<ProtoPalette_*,_std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>_>
                     ::operator*(&__end2_1);
          fputs("[ ",_stderr);
          __begin3 = (const_iterator)__range3;
          __end3 = ProtoPalette::begin(__range3);
          pvStack_28288 = ProtoPalette::end((ProtoPalette *)__begin3);
          for (; __end3 != pvStack_28288; __end3 = __end3 + 1) {
            uStack_2828a = *__end3;
            fprintf(_stderr,"$%04x, ",(ulong)uStack_2828a);
          }
          fputs("]\n",_stderr);
          __gnu_cxx::
          __normal_iterator<ProtoPalette_*,_std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>_>
          ::operator++(&__end2_1);
        }
      }
      if (options.palSpecType == EMBEDDED) {
        generatePalSpec((Png *)&colors);
      }
      if (options.palSpecType == NO_SPEC) {
        generatePalettes((tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                          *)&mappings,
                         (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)auStack_281a8,
                         (Png *)&colors);
      }
      else {
        makePalsAsSpecified((tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                             *)&mappings,
                            (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)auStack_281a8);
      }
      mappings_00 = std::
                    get<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
                              ((tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                                *)&mappings);
      palettes_00 = std::
                    get<1ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
                              ((tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                                *)&mappings);
      outputPalettes(palettes_00);
      if ((options.allowDedup & 1U) == 0) {
        uVar6 = Png::getHeight((Png *)&colors);
        tiles.tiles.super__Vector_base<const_TileData_*,_std::allocator<const_TileData_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = uVar6 >> 3;
        uVar6 = Png::getWidth((Png *)&colors);
        tiles.tiles.super__Vector_base<const_TileData_*,_std::allocator<const_TileData_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = uVar6 >> 3;
        uVar8 = (uint)tiles.tiles.
                      super__Vector_base<const_TileData_*,_std::allocator<const_TileData_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage *
                tiles.tiles.super__Vector_base<const_TileData_*,_std::allocator<const_TileData_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        pvVar16 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,0);
        uVar1 = *pvVar16;
        pvVar16 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,1);
        if ((uint)uVar1 + (uint)*pvVar16 < uVar8) {
          uVar8 = (uint)tiles.tiles.
                        super__Vector_base<const_TileData_*,_std::allocator<const_TileData_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage *
                  tiles.tiles.
                  super__Vector_base<const_TileData_*,_std::allocator<const_TileData_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_;
          pvVar16 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,0);
          uVar1 = *pvVar16;
          pvVar16 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,1);
          fatal("Image contains %u tiles, exceeding the limit of %u + %u",(ulong)uVar8,(ulong)uVar1,
                (ulong)*pvVar16);
        }
        bVar4 = std::optional<std::filesystem::__cxx11::path>::has_value(&options.output);
        if (bVar4) {
          Options::verbosePrint(&options,'\x02',"Generating unoptimized tile data...\n");
          unoptimized::outputTileData
                    ((Png *)&colors,(DefaultInitVec<AttrmapEntry> *)&__range1,palettes_00,
                     mappings_00);
        }
        bVar4 = std::optional<std::filesystem::__cxx11::path>::has_value(&options.tilemap);
        if (((bVar4) ||
            (bVar4 = std::optional<std::filesystem::__cxx11::path>::has_value(&options.attrmap),
            bVar4)) ||
           (bVar4 = std::optional<std::filesystem::__cxx11::path>::has_value(&options.palmap), bVar4
           )) {
          Options::verbosePrint
                    (&options,'\x02',
                     "Generating unoptimized tilemap and/or attrmap and/or palmap...\n");
          unoptimized::outputMaps((DefaultInitVec<AttrmapEntry> *)&__range1,mappings_00);
        }
      }
      else {
        Options::verbosePrint(&options,'\x02',"Deduplicating tiles...\n");
        optimized::dedupTiles
                  ((UniqueTiles *)auStack_28328,(Png *)&colors,
                   (DefaultInitVec<AttrmapEntry> *)&__range1,palettes_00,mappings_00);
        sVar14 = optimized::UniqueTiles::size((UniqueTiles *)auStack_28328);
        pvVar16 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,0);
        uVar1 = *pvVar16;
        pvVar16 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,1);
        if ((ulong)(long)(int)((uint)uVar1 + (uint)*pvVar16) < sVar14) {
          sVar14 = optimized::UniqueTiles::size((UniqueTiles *)auStack_28328);
          pvVar16 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,0);
          uVar1 = *pvVar16;
          pvVar16 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,1);
          fatal("Image contains %zu tiles, exceeding the limit of %u + %u",sVar14,(ulong)uVar1,
                (ulong)*pvVar16);
        }
        bVar4 = std::optional<std::filesystem::__cxx11::path>::has_value(&options.output);
        if (bVar4) {
          Options::verbosePrint(&options,'\x02',"Generating optimized tile data...\n");
          optimized::outputTileData((UniqueTiles *)auStack_28328);
        }
        bVar4 = std::optional<std::filesystem::__cxx11::path>::has_value(&options.tilemap);
        if (bVar4) {
          Options::verbosePrint(&options,'\x02',"Generating optimized tilemap...\n");
          optimized::outputTilemap((DefaultInitVec<AttrmapEntry> *)&__range1);
        }
        bVar4 = std::optional<std::filesystem::__cxx11::path>::has_value(&options.attrmap);
        if (bVar4) {
          Options::verbosePrint(&options,'\x02',"Generating optimized attrmap...\n");
          optimized::outputAttrmap((DefaultInitVec<AttrmapEntry> *)&__range1,mappings_00);
        }
        bVar4 = std::optional<std::filesystem::__cxx11::path>::has_value(&options.palmap);
        if (bVar4) {
          Options::verbosePrint(&options,'\x02',"Generating optimized palmap...\n");
          optimized::outputPalmap((DefaultInitVec<AttrmapEntry> *)&__range1,mappings_00);
        }
        optimized::UniqueTiles::~UniqueTiles((UniqueTiles *)auStack_28328);
      }
      std::
      tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
      ::~tuple((tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                *)&mappings);
      std::
      vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>::
      ~vector((vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
               *)&__range1);
      std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::~vector
                ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)auStack_281a8);
      Png::~Png((Png *)&colors);
      return;
    }
    TVar18 = Png::TilesVisitor::iterator::operator*((iterator *)&__end1.y);
    tile._png = TVar18._8_8_;
    tileColors._colorIndices._M_elems = (array<unsigned_short,_4UL>)TVar18._png;
    ProtoPalette::ProtoPalette((ProtoPalette *)&attrs);
    pvVar11 = std::
              vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
              ::emplace_back<>((vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
                                *)&__range1);
    x._3_1_ = 0;
    color.red = '\0';
    color.green = '\0';
    color.blue = '\0';
    color.alpha = '\0';
    for (; (uint)color < 8; color = (Rgba)((int)color + 1)) {
      for (n._4_4_ = 0; n._4_4_ < 8; n._4_4_ = n._4_4_ + 1) {
        n._0_4_ = Png::TilesVisitor::Tile::pixel((Tile *)&tileColors,n._4_4_,(uint32_t)color);
        bVar4 = Rgba::isTransparent((Rgba *)&n);
        if (!bVar4) {
          color_00 = Rgba::cgbColor((Rgba *)&n);
          bVar4 = ProtoPalette::add((ProtoPalette *)&attrs,color_00);
          if (bVar4) {
            x._3_1_ = x._3_1_ + 1;
          }
        }
      }
    }
    bVar4 = ProtoPalette::empty((ProtoPalette *)&attrs);
    if (bVar4) {
      pvVar11->protoPaletteID = 0xffffffffffffffff;
    }
    else {
      for (__range2_1 = (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)0x0;
          pvVar12 = (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                    std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::size
                              ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)auStack_281a8)
          , __range2_1 < pvVar12;
          __range2_1 = (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                       ((long)&(__range2_1->
                               super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>).
                               _M_impl.super__Vector_impl_data._M_start + 1)) {
        pvVar13 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::operator[]
                            ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)auStack_281a8,
                             (size_type)__range2_1);
        CVar7 = ProtoPalette::compare((ProtoPalette *)&attrs,pvVar13);
        if (CVar7 == THEY_BIGGER) {
LAB_00129980:
          pvVar11->protoPaletteID = (size_t)__range2_1;
          goto LAB_00129aa5;
        }
        if ((CVar7 != NEITHER) && (CVar7 == WE_BIGGER)) {
          pvVar13 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::operator[]
                              ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)auStack_281a8,
                               (size_type)__range2_1);
          *(AttrmapEntry **)(pvVar13->_colorIndices)._M_elems = attrs;
          goto LAB_00129980;
        }
      }
      bVar5 = Options::maxOpaqueColors(&options);
      pPVar3 = tile._png;
      if (bVar5 < x._3_1_) {
        uVar2 = (ulong)tile._png >> 0x20;
        bVar5 = Options::maxOpaqueColors(&options);
        fatal("Tile at (%u, %u) has %zu opaque colors, more than %u!",(ulong)pPVar3 & 0xffffffff,
              uVar2,(ulong)x._3_1_,(ulong)bVar5);
      }
      sVar14 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::size
                         ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)auStack_281a8);
      pvVar11->protoPaletteID = sVar14;
      sVar14 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::size
                         ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)auStack_281a8);
      if (sVar14 == 0xffffffffffffffff) {
        fatal("Reached %zu proto-palettes... sorry, this image is too much for me to handle :(",
              0xffffffffffffffff);
      }
      std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::push_back
                ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)auStack_281a8,
                 (value_type *)&attrs);
    }
LAB_00129aa5:
    Png::TilesVisitor::iterator::operator++((iterator *)&__end1.y);
  } while( true );
}

Assistant:

void process() {
	options.verbosePrint(Options::VERB_CFG, "Using libpng %s\n", png_get_libpng_ver(nullptr));

	options.verbosePrint(Options::VERB_LOG_ACT, "Reading tiles...\n");
	Png png(*options.input); // This also sets `hasTransparentPixels` as a side effect
	ImagePalette const &colors = png.getColors();

	// Now, we have all the image's colors in `colors`
	// The next step is to order the palette

	if (options.verbosity >= Options::VERB_INTERM) {
		fputs("Image colors: [ ", stderr);
		for (auto const &slot : colors) {
			if (!slot.has_value()) {
				continue;
			}
			fprintf(stderr, "#%08x, ", slot->toCSS());
		}
		fputs("]\n", stderr);
	}

	// Now, iterate through the tiles, generating proto-palettes as we go
	// We do this unconditionally because this performs the image validation (which we want to
	// perform even if no output is requested), and because it's necessary to generate any
	// output (with the exception of an un-duplicated tilemap, but that's an acceptable loss.)
	std::vector<ProtoPalette> protoPalettes;
	DefaultInitVec<AttrmapEntry> attrmap{};

	for (auto tile : png.visitAsTiles()) {
		ProtoPalette tileColors;
		AttrmapEntry &attrs = attrmap.emplace_back();
		uint8_t nbColorsInTile = 0;

		for (uint32_t y = 0; y < 8; ++y) {
			for (uint32_t x = 0; x < 8; ++x) {
				Rgba color = tile.pixel(x, y);
				if (!color.isTransparent()) { // Do not count transparency in for packing
					// Add the color to the proto-pal (if not full), and count it if it was unique.
					if (tileColors.add(color.cgbColor())) {
						++nbColorsInTile;
					}
				}
			}
		}

		if (tileColors.empty()) {
			// "Empty" proto-palettes screw with the packing process, so discard those
			attrs.protoPaletteID = AttrmapEntry::transparent;
			continue;
		}

		// Insert the proto-palette, making sure to avoid overlaps
		for (size_t n = 0; n < protoPalettes.size(); ++n) {
			switch (tileColors.compare(protoPalettes[n])) {
			case ProtoPalette::WE_BIGGER:
				protoPalettes[n] = tileColors; // Override them
				// Remove any other proto-palettes that we encompass
				// (Example [(0, 1), (0, 2)], inserting (0, 1, 2))
				/*
				 * The following code does its job, except that references to the removed
				 * proto-palettes are not updated, causing issues.
				 * TODO: overlap might not be detrimental to the packing algorithm.
				 * Investigation is necessary, especially if pathological cases are found.
				 *
				 * for (size_t i = protoPalettes.size(); --i != n;) {
				 *     if (tileColors.compare(protoPalettes[i]) == ProtoPalette::WE_BIGGER) {
				 *         protoPalettes.erase(protoPalettes.begin() + i);
				 *     }
				 * }
				 */
				[[fallthrough]];

			case ProtoPalette::THEY_BIGGER:
				// Do nothing, they already contain us
				attrs.protoPaletteID = n;
				goto contained;

			case ProtoPalette::NEITHER:
				break; // Keep going
			}
		}

		if (nbColorsInTile > options.maxOpaqueColors()) {
			fatal("Tile at (%" PRIu32 ", %" PRIu32 ") has %zu opaque colors, more than %" PRIu8 "!",
			      tile.x, tile.y, nbColorsInTile, options.maxOpaqueColors());
		}

		attrs.protoPaletteID = protoPalettes.size();
		if (protoPalettes.size() == AttrmapEntry::transparent) { // Check for overflow
			fatal("Reached %zu proto-palettes... sorry, this image is too much for me to handle :(",
			      AttrmapEntry::transparent);
		}
		protoPalettes.push_back(tileColors);
contained:;
	}

	options.verbosePrint(Options::VERB_INTERM, "Image contains %zu proto-palette%s\n",
	                     protoPalettes.size(), protoPalettes.size() != 1 ? "s" : "");
	if (options.verbosity >= Options::VERB_INTERM) {
		for (auto const &protoPal : protoPalettes) {
			fputs("[ ", stderr);
			for (uint16_t color : protoPal) {
				fprintf(stderr, "$%04x, ", color);
			}
			fputs("]\n", stderr);
		}
	}

	if (options.palSpecType == Options::EMBEDDED) {
		generatePalSpec(png);
	}
	auto [mappings, palettes] = options.palSpecType == Options::NO_SPEC
	                                ? generatePalettes(protoPalettes, png)
	                                : makePalsAsSpecified(protoPalettes);
	outputPalettes(palettes);

	// If deduplication is not happening, we just need to output the tile data and/or maps as-is
	if (!options.allowDedup) {
		uint32_t const nbTilesH = png.getHeight() / 8, nbTilesW = png.getWidth() / 8;

		// Check the tile count
		if (nbTilesW * nbTilesH > options.maxNbTiles[0] + options.maxNbTiles[1]) {
			fatal("Image contains %" PRIu32 " tiles, exceeding the limit of %" PRIu16 " + %" PRIu16,
			      nbTilesW * nbTilesH, options.maxNbTiles[0], options.maxNbTiles[1]);
		}

		if (options.output.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating unoptimized tile data...\n");
			unoptimized::outputTileData(png, attrmap, palettes, mappings);
		}

		if (options.tilemap.has_value() || options.attrmap.has_value()
		    || options.palmap.has_value()) {
			options.verbosePrint(
			    Options::VERB_LOG_ACT,
			    "Generating unoptimized tilemap and/or attrmap and/or palmap...\n");
			unoptimized::outputMaps(attrmap, mappings);
		}
	} else {
		// All of these require the deduplication process to be performed to be output
		options.verbosePrint(Options::VERB_LOG_ACT, "Deduplicating tiles...\n");
		optimized::UniqueTiles tiles = optimized::dedupTiles(png, attrmap, palettes, mappings);

		if (tiles.size() > options.maxNbTiles[0] + options.maxNbTiles[1]) {
			fatal("Image contains %zu tiles, exceeding the limit of %" PRIu16 " + %" PRIu16,
			      tiles.size(), options.maxNbTiles[0], options.maxNbTiles[1]);
		}

		if (options.output.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating optimized tile data...\n");
			optimized::outputTileData(tiles);
		}

		if (options.tilemap.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating optimized tilemap...\n");
			optimized::outputTilemap(attrmap);
		}

		if (options.attrmap.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating optimized attrmap...\n");
			optimized::outputAttrmap(attrmap, mappings);
		}

		if (options.palmap.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating optimized palmap...\n");
			optimized::outputPalmap(attrmap, mappings);
		}
	}
}